

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.hpp
# Opt level: O2

int __thiscall common_server_client_setup::init(common_server_client_setup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SourceLineInfo *lineInfo;
  sockaddr *__addr;
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_28;
  
  bind_ip4_loopback_abi_cxx11_((string *)&catchAssertionHandler,&this->server);
  std::__cxx11::string::operator=((string *)&this->endpoint,(string *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  lineInfo = &local_28;
  local_28.file =
       "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/testutil.hpp";
  local_28.line = 0x1b;
  macroName.m_size = 0xf;
  macroName.m_start = "REQUIRE_NOTHROW";
  capturedExpression.m_size = 0x18;
  capturedExpression.m_start = "client.connect(endpoint)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,lineInfo,capturedExpression,Normal);
  zmq::detail::socket_base::connect
            (&(this->client).super_socket_base,(int)&this->endpoint,__addr,(socklen_t)lineInfo);
  Catch::AssertionHandler::handleExceptionNotThrownAsExpected(&catchAssertionHandler);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return extraout_EAX;
}

Assistant:

void init()
    {
        endpoint = bind_ip4_loopback(server);
        REQUIRE_NOTHROW(client.connect(endpoint));
    }